

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement_data.cpp
# Opt level: O3

void __thiscall
duckdb::PreparedStatementData::Bind
          (PreparedStatementData *this,case_insensitive_map_t<BoundParameterData> *values)

{
  shared_ptr<duckdb::BoundParameterData,_true> *this_00;
  bool bVar1;
  iterator iVar2;
  BoundParameterData *pBVar3;
  BinderException *pBVar4;
  _Hash_node_base *p_Var5;
  Value value;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Value local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  Value local_70;
  
  CheckParameterCount(this,(values->_M_h)._M_element_count);
  p_Var5 = (this->value_map)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      iVar2 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&values->_M_h,(key_type *)(p_Var5 + 1));
      if (iVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar4 = (BinderException *)__cxa_allocate_exception(0x10);
        local_110.type_._0_8_ = (long)&local_110 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Could not find parameter with identifier %s","");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,p_Var5[1]._M_nxt,
                   (long)&(p_Var5[1]._M_nxt)->_M_nxt + (long)&(p_Var5[2]._M_nxt)->_M_nxt);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar4,(string *)&local_110,&local_d0);
        __cxa_throw(pBVar4,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      Value::Value(&local_110,
                   (Value *)((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
                                   ._M_cur + 0x28));
      this_00 = (shared_ptr<duckdb::BoundParameterData,_true> *)(p_Var5 + 5);
      pBVar3 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      bVar1 = Value::DefaultTryCastAs(&local_110,&pBVar3->return_type,false);
      if (!bVar1) {
        pBVar4 = (BinderException *)__cxa_allocate_exception(0x10);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,
                   "Type mismatch for binding parameter with identifier %s, expected type %s but got type %s"
                   ,"");
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,p_Var5[1]._M_nxt,
                   (long)&(p_Var5[1]._M_nxt)->_M_nxt + (long)&(p_Var5[2]._M_nxt)->_M_nxt);
        pBVar3 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
        LogicalType::ToString_abi_cxx11_(&local_90,&pBVar3->return_type);
        LogicalType::ToString_abi_cxx11_(&local_b0,&local_110.type_);
        BinderException::BinderException<std::__cxx11::string,char_const*,char_const*>
                  (pBVar4,&local_150,&local_130,local_90._M_dataplus._M_p,local_b0._M_dataplus._M_p)
        ;
        __cxa_throw(pBVar4,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pBVar3 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      Value::Value(&local_70,&local_110);
      Value::operator=(&pBVar3->value,&local_70);
      Value::~Value(&local_70);
      Value::~Value(&local_110);
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void PreparedStatementData::Bind(case_insensitive_map_t<BoundParameterData> values) {
	// set parameters
	D_ASSERT(!unbound_statement || unbound_statement->named_param_map.size() == properties.parameter_count);
	CheckParameterCount(values.size());

	// bind the required values
	for (auto &it : value_map) {
		const string &identifier = it.first;
		auto lookup = values.find(identifier);
		if (lookup == values.end()) {
			throw BinderException("Could not find parameter with identifier %s", identifier);
		}
		D_ASSERT(it.second);
		auto value = lookup->second.GetValue();
		if (!value.DefaultTryCastAs(it.second->return_type)) {
			throw BinderException(
			    "Type mismatch for binding parameter with identifier %s, expected type %s but got type %s", identifier,
			    it.second->return_type.ToString().c_str(), value.type().ToString().c_str());
		}
		it.second->SetValue(std::move(value));
	}
}